

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void __thiscall
xemmai::t_heap<xemmai::t_object>::f_free(t_heap<xemmai::t_object> *this,t_object *a_p)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  iterator __position;
  
  switch(a_p->v_rank) {
  case 0:
    t_of<0UL,_65536UL>::f_free(&this->v_of0,a_p);
    return;
  case 1:
    t_of<1UL,_16384UL>::f_free(&this->v_of1,a_p);
    return;
  case 2:
    t_of<2UL,_4096UL>::f_free(&this->v_of2,a_p);
    return;
  case 3:
    t_of<3UL,_1024UL>::f_free(&this->v_of3,a_p);
    return;
  case 4:
    t_of<4UL,_256UL>::f_free(&this->v_of4,a_p);
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->v_mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var3 = (this->v_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &(this->v_blocks)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var2 = __position._M_node;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (*(t_object **)(p_Var3 + 1) >= a_p) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(t_object **)(p_Var3 + 1) < a_p];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((p_Var2 != __position._M_node) && (*(t_object **)(p_Var2 + 1) <= a_p)) {
      __position._M_node = p_Var2;
    }
  }
  p_Var3 = __position._M_node[1]._M_parent;
  std::
  _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
                      *)&this->v_blocks,__position);
  pthread_mutex_unlock((pthread_mutex_t *)&this->v_mutex);
  munmap(a_p,(size_t)p_Var3);
  this->v_freed = this->v_freed + 1;
  return;
}

Assistant:

void f_free(T* a_p)
	{
		switch (a_p->v_rank) {
		case 0:
			v_of0.f_free(a_p);
			break;
		case 1:
			v_of1.f_free(a_p);
			break;
		case 2:
			v_of2.f_free(a_p);
			break;
		case 3:
			v_of3.f_free(a_p);
			break;
		case 4:
			v_of4.f_free(a_p);
			break;
		default:
			v_mutex.lock();
			auto i = v_blocks.find(a_p);
			auto n = i->second;
			v_blocks.erase(i);
			v_mutex.unlock();
			f_unmap(a_p, n);
			++v_freed;
		}
	}